

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_dx_iface.c
# Opt level: O1

aom_codec_err_t ctrl_get_new_frame_image(aom_codec_alg_priv_t_conflict *ctx,__va_list_tag *args)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  aom_codec_err_t aVar5;
  long *plVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  YV12_BUFFER_CONFIG new_frame;
  anon_union_8_2_2fc10223_for_yv12_buffer_config_0 local_d8;
  int local_d0;
  int local_c8;
  int local_c0;
  int local_b8;
  int iStack_b4;
  long local_b0;
  long lStack_a8;
  long local_a0;
  undefined8 local_68;
  undefined8 local_50;
  int local_48;
  int iStack_44;
  int local_40;
  undefined8 local_3c;
  int local_34;
  byte local_30;
  undefined8 local_2c;
  int local_24;
  int iStack_20;
  byte bStack_18;
  
  uVar3 = args->gp_offset;
  if ((ulong)uVar3 < 0x29) {
    plVar6 = (long *)((ulong)uVar3 + (long)args->reg_save_area);
    args->gp_offset = uVar3 + 8;
  }
  else {
    plVar6 = (long *)args->overflow_arg_area;
    args->overflow_arg_area = plVar6 + 1;
  }
  piVar1 = (int *)*plVar6;
  if (piVar1 == (int *)0x0) {
    aVar5 = AOM_CODEC_INVALID_PARAM;
  }
  else {
    iVar2 = av1_get_last_show_frame(ctx->ppi->cpi,(YV12_BUFFER_CONFIG *)&local_d8.field_0);
    aVar5 = AOM_CODEC_ERROR;
    if (iVar2 == 0) {
      auVar8._0_4_ = -(uint)(local_48 == 0);
      auVar8._4_4_ = -(uint)(local_48 == 0);
      auVar8._8_4_ = -(uint)(iStack_44 == 0);
      auVar8._12_4_ = -(uint)(iStack_44 == 0);
      uVar3 = movmskpd(1,auVar8);
      bVar7 = (uVar3 & 2) != 0;
      iVar2 = 0x102;
      if (bVar7) {
        iVar2 = (uVar3 & 1) + 0x105;
      }
      uVar4 = 0xc;
      if (bVar7) {
        uVar4 = uVar3 << 3 | 0x10;
      }
      *piVar1 = iVar2;
      *(undefined8 *)(piVar1 + 1) = local_3c;
      piVar1[3] = local_34;
      piVar1[4] = (uint)local_30;
      *(undefined8 *)(piVar1 + 5) = local_2c;
      piVar1[9] = 8;
      piVar1[7] = local_d8.field_0.y_width;
      piVar1[8] = local_d0;
      piVar1[10] = local_c8;
      piVar1[0xb] = local_c0;
      piVar1[0xc] = local_24;
      piVar1[0xd] = iStack_20;
      piVar1[0xe] = local_48;
      piVar1[0xf] = iStack_44;
      *(long *)(piVar1 + 0x10) = local_b0;
      *(long *)(piVar1 + 0x12) = lStack_a8;
      *(long *)(piVar1 + 0x14) = local_a0;
      piVar1[0x16] = local_b8;
      piVar1[0x17] = iStack_b4;
      piVar1[0x18] = iStack_b4;
      if ((bStack_18 & 8) != 0) {
        uVar4 = uVar4 * 2;
        *(byte *)((long)piVar1 + 1) = *(byte *)((long)piVar1 + 1) | 8;
        piVar1[9] = local_40;
        *(long *)(piVar1 + 0x10) = local_b0 * 2;
        *(long *)(piVar1 + 0x12) = lStack_a8 * 2;
        *(long *)(piVar1 + 0x14) = local_a0 * 2;
        *(ulong *)(piVar1 + 0x16) = CONCAT44(iStack_b4 * 2,local_b8 * 2);
        piVar1[0x18] = iStack_b4 * 2;
      }
      piVar1[0x1c] = uVar4;
      aVar5 = AOM_CODEC_OK;
      piVar1[0x20] = 0;
      piVar1[0x21] = 0;
      *(undefined8 *)(piVar1 + 0x22) = local_68;
      piVar1[0x24] = 0;
      piVar1[0x25] = 0;
      *(undefined8 *)(piVar1 + 0x1a) = local_50;
      piVar1[0x26] = 0;
      piVar1[0x27] = 0;
    }
  }
  return aVar5;
}

Assistant:

static aom_codec_err_t ctrl_get_new_frame_image(aom_codec_alg_priv_t *ctx,
                                                va_list args) {
  aom_image_t *new_img = va_arg(args, aom_image_t *);
  if (new_img) {
    YV12_BUFFER_CONFIG new_frame;
    AVxWorker *const worker = ctx->frame_worker;
    FrameWorkerData *const frame_worker_data = (FrameWorkerData *)worker->data1;

    if (av1_get_frame_to_show(frame_worker_data->pbi, &new_frame) == 0) {
      yuvconfig2image(new_img, &new_frame, NULL);
      return AOM_CODEC_OK;
    } else {
      return AOM_CODEC_ERROR;
    }
  } else {
    return AOM_CODEC_INVALID_PARAM;
  }
}